

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_8edda9::HandleExportAndroidMKMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  string *psVar2;
  long lVar3;
  cmGlobalGenerator *pcVar4;
  cmExportSet *pcVar5;
  string *__args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_4;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  undefined1 local_35c;
  bool local_35b;
  undefined1 local_35a;
  bool exportOld;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_358;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_350;
  string fname;
  undefined1 local_328 [36];
  MessageLevel message;
  string *local_300;
  cmMakefile *local_2f8;
  undefined1 local_2f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string exp;
  string filename;
  string name_space;
  string local_268;
  Helper helper;
  ParseResult local_218;
  cmInstallCommandArguments ica;
  
  Helper::Helper(&helper,status);
  std::__cxx11::string::string((string *)&local_268,(string *)&helper.DefaultComponentName);
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  exp._M_dataplus._M_p = (pointer)&exp.field_2;
  exp._M_string_length = 0;
  exp.field_2._M_local_buf[0] = '\0';
  name_space._M_dataplus._M_p = (pointer)&name_space.field_2;
  name_space._M_string_length = 0;
  name_space.field_2._M_local_buf[0] = '\0';
  exportOld = false;
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  name.super_string_view._M_str = "EXPORT_ANDROID_MK";
  name.super_string_view._M_len = 0x11;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(&ica.super_cmArgumentParser<void>,name,&exp);
  name_00.super_string_view._M_str = "NAMESPACE";
  name_00.super_string_view._M_len = 9;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_00,&name_space);
  name_01.super_string_view._M_str = "EXPORT_LINK_INTERFACE_LIBRARIES";
  name_01.super_string_view._M_len = 0x1f;
  cmArgumentParser<void>::Bind<bool>(&ica.super_cmArgumentParser<void>,name_01,&exportOld);
  name_02.super_string_view._M_str = "FILE";
  name_02.super_string_view._M_len = 4;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_02,&filename);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_218,&ica.super_cmArgumentParser<void>,args,&unknownArgs,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_218);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = cmInstallCommandArguments::Finalize(&ica);
    if (bVar1) {
      psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
      if (psVar2->_M_string_length == 0) {
        cmStrCat<std::__cxx11::string_const&,char_const(&)[23]>
                  (&fname,(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                   (char (*) [23])" given no DESTINATION!");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_002a1621;
      }
      std::__cxx11::string::string((string *)&fname,(string *)&filename);
      lVar3 = std::__cxx11::string::find_first_of((char *)&fname,0x6ad5ff);
      if (lVar3 == -1) {
        if (fname._M_string_length != 0) {
          cmsys::SystemTools::GetFilenameLastExtension((string *)local_328,&fname);
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_328,".mk");
          std::__cxx11::string::~string((string *)local_328);
          if (bVar1) {
            cmStrCat<std::__cxx11::string_const&,char_const(&)[34],std::__cxx11::string&,char_const(&)[59]>
                      ((string *)local_328,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (char (*) [34])" given invalid export file name \"",&fname,
                       (char (*) [59])
                       "\".  The FILE argument must specify a name ending in \".mk\".");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002a1804;
          }
        }
        lVar3 = std::__cxx11::string::find_first_of((char *)&fname,0x6ad5ff);
        if (lVar3 != -1) {
          cmStrCat<std::__cxx11::string_const&,char_const(&)[21],std::__cxx11::string&,char_const(&)[144]>
                    ((string *)local_328,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (char (*) [21])" given export name \"",&exp,
                     (char (*) [144])
                     "\".  This name cannot be safely converted to a file name.  Specify a different export name or use the FILE option to set a file name explicitly."
                    );
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002a1804;
        }
        if (fname._M_string_length == 0) {
          std::__cxx11::string::assign((char *)&fname);
        }
        pcVar4 = cmMakefile::GetGlobalGenerator(helper.Makefile);
        pcVar5 = cmExportSetMap::operator[](&pcVar4->ExportSets,&exp);
        message = cmInstallGenerator::SelectMessageLevel(helper.Makefile,false);
        local_2f8 = helper.Makefile;
        local_2f0 = (undefined1  [8])pcVar5;
        psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
        __args_3 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(&ica);
        __args_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmInstallCommandArguments::GetConfigurations_abi_cxx11_(&ica);
        local_300 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
        local_35a = cmInstallCommandArguments::GetExcludeFromAll(&ica);
        local_35b = true;
        local_35c = 0;
        cmMakefile::GetBacktrace((cmMakefile *)local_328);
        std::
        make_unique<cmInstallExportGenerator,cmExportSet*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[1],bool&,bool,bool,cmListFileBacktrace>
                  ((cmExportSet **)&local_358,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                   psVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)__args_3,__args_4,(MessageLevel *)local_300,(bool *)&message,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_35a,
                   &fname,(char (*) [1])&name_space,(bool *)0x70a819,&exportOld,&local_35b,
                   (cmListFileBacktrace *)&local_35c);
        local_350._M_head_impl = local_358._M_head_impl;
        local_358._M_head_impl = (cmInstallGenerator *)0x0;
        cmMakefile::AddInstallGenerator
                  (local_2f8,
                   (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                   &local_350);
        if (local_350._M_head_impl != (cmInstallGenerator *)0x0) {
          (*((local_350._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
        }
        local_350._M_head_impl = (cmInstallGenerator *)0x0;
        if (local_358._M_head_impl != (cmInstallGenerator *)0x0) {
          (*((local_358._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
        }
        local_358._M_head_impl = (cmInstallGenerator *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_328 + 8));
        bVar1 = true;
      }
      else {
        cmStrCat<std::__cxx11::string_const&,char_const(&)[34],std::__cxx11::string&,char_const(&)[93]>
                  ((string *)local_328,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   (char (*) [34])" given invalid export file name \"",&fname,
                   (char (*) [93])
                   "\".  The FILE argument may not contain a path.  Specify the path in the DESTINATION argument."
                  );
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002a1804:
        std::__cxx11::string::~string((string *)local_328);
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&fname);
      goto LAB_002a16c1;
    }
  }
  else {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[26],std::__cxx11::string&,char_const(&)[3]>
              (&fname,(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,(char (*) [26])0x6ab567,
               unknownArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(char (*) [3])0x6e2148);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002a1621:
    std::__cxx11::string::~string((string *)&fname);
  }
  bVar1 = false;
LAB_002a16c1:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&name_space);
  std::__cxx11::string::~string((string *)&exp);
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  std::__cxx11::string::~string((string *)&helper.DefaultComponentName);
  return bVar1;
}

Assistant:

bool HandleExportAndroidMKMode(std::vector<std::string> const& args,
                               cmExecutionStatus& status)
{
#ifndef CMAKE_BOOTSTRAP
  Helper helper(status);

  // This is the EXPORT mode.
  cmInstallCommandArguments ica(helper.DefaultComponentName);

  std::string exp;
  std::string name_space;
  bool exportOld = false;
  std::string filename;

  ica.Bind("EXPORT_ANDROID_MK"_s, exp);
  ica.Bind("NAMESPACE"_s, name_space);
  ica.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, exportOld);
  ica.Bind("FILE"_s, filename);

  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Check the file name.
  std::string fname = filename;
  if (fname.find_first_of(":/\\") != std::string::npos) {
    status.SetError(cmStrCat(args[0], " given invalid export file name \"",
                             fname,
                             "\".  The FILE argument may not contain a path.  "
                             "Specify the path in the DESTINATION argument."));
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".mk") {
    status.SetError(cmStrCat(
      args[0], " given invalid export file name \"", fname,
      R"(".  The FILE argument must specify a name ending in ".mk".)"));
    return false;
  }
  if (fname.find_first_of(":/\\") != std::string::npos) {
    status.SetError(
      cmStrCat(args[0], " given export name \"", exp,
               "\".  "
               "This name cannot be safely converted to a file name.  "
               "Specify a different export name or use the FILE option to set "
               "a file name explicitly."));
    return false;
  }
  // Use the default name
  if (fname.empty()) {
    fname = "Android.mk";
  }

  cmExportSet& exportSet =
    helper.Makefile->GetGlobalGenerator()->GetExportSets()[exp];

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile);

  // Create the export install generator.
  helper.Makefile->AddInstallGenerator(
    cm::make_unique<cmInstallExportGenerator>(
      &exportSet, ica.GetDestination(), ica.GetPermissions(),
      ica.GetConfigurations(), ica.GetComponent(), message,
      ica.GetExcludeFromAll(), fname, name_space, "", exportOld, true, false,
      helper.Makefile->GetBacktrace()));

  return true;
#else
  static_cast<void>(args);
  status.SetError("EXPORT_ANDROID_MK not supported in bootstrap cmake");
  return false;
#endif
}